

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

JObject * __thiscall
pstack::JObject::
field<char[8],std::map<unsigned_char,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,char>
          (JObject *this,char (*k) [8],
          map<unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          *v,char *c)

{
  ostream *os;
  JSON<pstack::Field<char[8],_std::map<unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_char>
  local_48;
  undefined1 local_38 [8];
  Field<char[8],_std::map<unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  field;
  char *c_local;
  map<unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *v_local;
  char (*k_local) [8];
  JObject *this_local;
  
  field.v = (map<unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             *)c;
  Field<char[8],_std::map<unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  ::Field((Field<char[8],_std::map<unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
           *)local_38,k,v);
  os = std::operator<<(this->os,this->sep);
  local_48 = json<pstack::Field<char[8],std::map<unsigned_char,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>,char>
                       ((Field<char[8],_std::map<unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                         *)local_38,(char *)field.v);
  pstack::operator<<(os,&local_48);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }